

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_defaultConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_defaultConstructorConstRvalue_Test
          (optTyped_defaultConstructorConstRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorConstRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = []() -> const opt_type { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}